

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

void __thiscall kj::HttpHeaders::clear(HttpHeaders *this)

{
  StringPtr *header;
  StringPtr *pSVar1;
  long lVar2;
  
  pSVar1 = (this->indexedHeaders).ptr;
  for (lVar2 = (this->indexedHeaders).size_ << 4; lVar2 != 0; lVar2 = lVar2 + -0x10) {
    (pSVar1->content).ptr = "";
    (pSVar1->content).size_ = 1;
    pSVar1 = pSVar1 + 1;
  }
  (this->unindexedHeaders).builder.pos = (this->unindexedHeaders).builder.ptr;
  return;
}

Assistant:

inline constexpr T* begin() KJ_LIFETIMEBOUND { return ptr; }